

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromMemory
          (TinyGLTF *this,Model *model,string *err,string *warn,uchar *bytes,uint size,
          string *base_dir,uint check_sections)

{
  ulong uVar1;
  uint json_str_length;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((((0x13 < size) && (*bytes == 'g')) && (bytes[1] == 'l')) &&
     ((bytes[2] == 'T' && (bytes[3] == 'F')))) {
    json_str_length = *(uint *)(bytes + 0xc);
    uVar6 = (ulong)json_str_length;
    if (json_str_length >> 2 < 0x3ffffffb) {
      uVar4 = uVar6 + 0x14;
      uVar7 = (ulong)*(uint *)(bytes + 8);
      if ((((*(uint *)(bytes + 8) <= size && uVar6 != 0) && uVar4 <= size) && (uVar4 <= uVar7)) &&
         ((*(int *)(bytes + 0x10) == 0x4e4f534a && ((json_str_length & 3) == 0)))) {
        if (uVar4 == uVar7) {
          this->bin_data_ = (uchar *)0x0;
          this->bin_size_ = 0;
        }
        else {
          uVar1 = uVar6 + 0x1c;
          if (uVar7 <= uVar1 && uVar1 - uVar7 != 0) {
            if (err == (string *)0x0) {
              return false;
            }
            std::__cxx11::to_string(&local_70,uVar1 - uVar7);
            std::operator+(&local_90,
                           "Insufficient storage space for Chunk1(BIN data). At least Chunk1 Must have 8 or more bytes, but got "
                           ,&local_70);
            std::operator+(&local_50,&local_90,".\n");
            std::__cxx11::string::operator=((string *)err,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_70);
            return false;
          }
          if (*(int *)(bytes + uVar6 + 0x18) != 0x4e4942) goto joined_r0x00117ea7;
          uVar2 = *(uint *)(bytes + uVar4);
          uVar4 = (ulong)uVar2;
          if (uVar4 == 0) {
            uVar4 = 0;
            puVar5 = (uchar *)0x0;
          }
          else {
            if (uVar2 < 4) goto joined_r0x00117ea7;
            if ((uVar2 & 3) != 0) {
              if (this->strictness_ != Permissive) goto joined_r0x00117ea7;
              if (warn != (string *)0x0) {
                std::__cxx11::string::append((char *)warn);
              }
            }
            if (uVar7 < uVar1 + uVar4) goto joined_r0x00117ea7;
            puVar5 = bytes + uVar6 + 0x1c;
          }
          this->bin_data_ = puVar5;
          this->bin_size_ = uVar4;
        }
        this->is_binary_ = true;
        bVar3 = LoadFromString(this,model,err,warn,(char *)(bytes + 0x14),json_str_length,base_dir,
                               check_sections);
        return bVar3;
      }
    }
  }
joined_r0x00117ea7:
  if (err != (string *)0x0) {
    std::__cxx11::string::assign((char *)err);
  }
  return false;
}

Assistant:

bool TinyGLTF::LoadBinaryFromMemory(Model *model, std::string *err,
                                    std::string *warn,
                                    const unsigned char *bytes,
                                    unsigned int size,
                                    const std::string &base_dir,
                                    unsigned int check_sections) {
  if (size < 20) {
    if (err) {
      (*err) = "Too short data size for glTF Binary.";
    }
    return false;
  }

  if (bytes[0] == 'g' && bytes[1] == 'l' && bytes[2] == 'T' &&
      bytes[3] == 'F') {
    // ok
  } else {
    if (err) {
      (*err) = "Invalid magic.";
    }
    return false;
  }

  unsigned int version;        // 4 bytes
  unsigned int length;         // 4 bytes
  unsigned int chunk0_length;  // 4 bytes
  unsigned int chunk0_format;  // 4 bytes;

  memcpy(&version, bytes + 4, 4);
  swap4(&version);
  memcpy(&length, bytes + 8, 4); // Total glb size, including header and all chunks.
  swap4(&length);
  memcpy(&chunk0_length, bytes + 12, 4);  // JSON data length
  swap4(&chunk0_length);
  memcpy(&chunk0_format, bytes + 16, 4);
  swap4(&chunk0_format);

  // https://registry.khronos.org/glTF/specs/2.0/glTF-2.0.html#binary-gltf-layout
  //
  // In case the Bin buffer is not present, the size is exactly 20 + size of
  // JSON contents,
  // so use "greater than" operator.
  //
  // https://github.com/syoyo/tinygltf/issues/372
  // Use 64bit uint to avoid integer overflow.
  uint64_t header_and_json_size = 20ull + uint64_t(chunk0_length);

  if (header_and_json_size > (std::numeric_limits<uint32_t>::max)()) {
    // Do not allow 4GB or more GLB data.
    if (err) {
      (*err) = "Invalid glTF binary. GLB data exceeds 4GB.";
    }
    return false;
  }

  if ((header_and_json_size > uint64_t(size)) || (chunk0_length < 1) ||
      (length > size) || (header_and_json_size > uint64_t(length)) ||
      (chunk0_format != 0x4E4F534A)) {  // 0x4E4F534A = JSON format.
    if (err) {
      (*err) = "Invalid glTF binary.";
    }
    return false;
  }

  // Padding check
  // The start and the end of each chunk must be aligned to a 4-byte boundary.
  // No padding check for chunk0 start since its 4byte-boundary is ensured.
  if ((header_and_json_size % 4) != 0) {
    if (err) {
      (*err) = "JSON Chunk end does not aligned to a 4-byte boundary.";
    }
    return false;
  }

  // std::cout << "header_and_json_size = " << header_and_json_size << "\n";
  // std::cout << "length = " << length << "\n";

  // Chunk1(BIN) data
  // The spec says: When the binary buffer is empty or when it is stored by
  // other means, this chunk SHOULD be omitted. So when header + JSON data ==
  // binary size, Chunk1 is omitted.
  if (header_and_json_size == uint64_t(length)) {
    bin_data_ = nullptr;
    bin_size_ = 0;
  } else {
    // Read Chunk1 info(BIN data)
    //
    // issue-440:
    // 'SHOULD' in glTF spec means 'RECOMMENDED',
    // So there is a situation that Chunk1(BIN) is composed of zero-sized BIN data
    // (chunksize(0) + binformat(BIN) = 8bytes).
    //
    if ((header_and_json_size + 8ull) > uint64_t(length)) {
      if (err) {
        (*err) =
            "Insufficient storage space for Chunk1(BIN data). At least Chunk1 "
            "Must have 8 or more bytes, but got " +
            std::to_string((header_and_json_size + 8ull) - uint64_t(length)) +
            ".\n";
      }
      return false;
    }

    unsigned int chunk1_length{0};  // 4 bytes
    unsigned int chunk1_format{0};  // 4 bytes;
    memcpy(&chunk1_length, bytes + header_and_json_size,
           4);  // Bin data length
    swap4(&chunk1_length);
    memcpy(&chunk1_format, bytes + header_and_json_size + 4, 4);
    swap4(&chunk1_format);

    if (chunk1_format != 0x004e4942) {
      if (err) {
        (*err) = "Invalid chunkType for Chunk1.";
      }
      return false;
    }

    if (chunk1_length == 0) {

      if (header_and_json_size + 8 > uint64_t(length)) {
        if (err) {
          (*err) = "BIN Chunk header location exceeds the GLB size.";
        }
        return false;
      }

      bin_data_ = nullptr;

    } else {

      // When BIN chunk size is not zero, at least Chunk1 should have 12 bytes(8 bytes(header) + 4 bytes(bin
      // payload could be 1~3 bytes, but need to be aligned to 4 bytes)

      if (chunk1_length < 4) {
        if (err) {
          (*err) = "Insufficient Chunk1(BIN) data size.";
        }
        return false;
      }

      if ((chunk1_length % 4) != 0) {
        if (strictness_==ParseStrictness::Permissive) {
          if (warn) {
            (*warn) += "BIN Chunk end is not aligned to a 4-byte boundary.\n";
          }
        }
        else {
          if (err) {
            (*err) = "BIN Chunk end is not aligned to a 4-byte boundary.";
          }
          return false;
        }
      }

      // +8 chunk1 header size.
      if (uint64_t(chunk1_length) + header_and_json_size + 8 > uint64_t(length)) {
        if (err) {
          (*err) = "BIN Chunk data length exceeds the GLB size.";
        }
        return false;
      }

      bin_data_ = bytes + header_and_json_size +
                  8;  // 4 bytes (bin_buffer_length) + 4 bytes(bin_buffer_format)
    }

    bin_size_ = size_t(chunk1_length);
  }

  is_binary_ = true;

  bool ret = LoadFromString(model, err, warn,
                            reinterpret_cast<const char *>(&bytes[20]),
                            chunk0_length, base_dir, check_sections);
  if (!ret) {
    return ret;
  }

  return true;
}